

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepFileImporter.cpp
# Opt level: O3

void __thiscall
Assimp::StepFile::StepFileImporter::InternReadFile
          (StepFileImporter *this,string *file,aiScene *pScene,IOSystem *pIOHandler)

{
  size_t __n;
  int iVar1;
  undefined4 extraout_var;
  DB *this_00;
  runtime_error *this_01;
  long *plVar2;
  size_type *psVar3;
  string *__rhs;
  shared_ptr<Assimp::IOStream> fileStream;
  shared_ptr<Assimp::IOStream> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  IOStream *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30 [2];
  
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(file->_M_dataplus)._M_p,mode_abi_cxx11_);
  local_60 = (IOStream *)CONCAT44(extraout_var,iVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::IOStream*>
            (&local_58,local_60);
  if (local_60 == (IOStream *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to open file ",file);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_80._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_80._M_dataplus._M_p == psVar3) {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80.field_2._8_8_ = plVar2[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar3;
    }
    local_80._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::runtime_error::runtime_error(this_01,(string *)&local_80);
    *(undefined ***)this_01 = &PTR__runtime_error_008dc448;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_90.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
  local_90.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_58._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    }
  }
  this_00 = STEP::ReadFileHeader(&local_90);
  local_50._M_dataplus._M_p = (pointer)this_00;
  if (local_90.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  __rhs = &(this_00->header).fileSchema;
  __n = (this_00->header).fileSchema._M_string_length;
  if ((__n != 0) && (__n == DAT_009b97b8)) {
    iVar1 = bcmp((__rhs->_M_dataplus)._M_p,StepFileSchema_abi_cxx11_,__n);
    if (iVar1 == 0) goto LAB_0066c619;
  }
  std::operator+(&local_80,"Unrecognized file schema: ",__rhs);
  std::runtime_error::runtime_error((runtime_error *)local_30,(string *)&local_80);
  local_30[0] = &PTR__runtime_error_008dc448;
  std::runtime_error::~runtime_error((runtime_error *)local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
LAB_0066c619:
  STEP::DB::~DB(this_00);
  operator_delete(this_00);
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  return;
}

Assistant:

void StepFileImporter::InternReadFile(const std::string &file, aiScene* pScene, IOSystem* pIOHandler) {
    // Read file into memory
    std::shared_ptr<IOStream> fileStream(pIOHandler->Open(file, mode));
    if (!fileStream.get()) {
        throw DeadlyImportError("Failed to open file " + file + ".");
    }

    std::unique_ptr<STEP::DB> db(STEP::ReadFileHeader(fileStream));
    const STEP::HeaderInfo& head = static_cast<const STEP::DB&>(*db).GetHeader();
    if (!head.fileSchema.size() || head.fileSchema != StepFileSchema) {
        DeadlyImportError("Unrecognized file schema: " + head.fileSchema);
    }
}